

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::AddPoint(Areal_Object_State_PDU *this,WorldCoordinates *P)

{
  KUINT16 *pKVar1;
  pointer *ppWVar2;
  iterator __position;
  KFLOAT64 KVar3;
  
  pKVar1 = &(this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + 0x18;
  __position._M_current =
       (this->m_vPoints).
       super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_vPoints).
      super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<KDIS::DATA_TYPE::WorldCoordinates,std::allocator<KDIS::DATA_TYPE::WorldCoordinates>>
    ::_M_realloc_insert<KDIS::DATA_TYPE::WorldCoordinates_const&>
              ((vector<KDIS::DATA_TYPE::WorldCoordinates,std::allocator<KDIS::DATA_TYPE::WorldCoordinates>>
                *)&this->m_vPoints,__position,P);
  }
  else {
    ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
         (_func_int **)&PTR__DataTypeBase_00224228;
    KVar3 = P->m_f64Y;
    (__position._M_current)->m_f64X = P->m_f64X;
    (__position._M_current)->m_f64Y = KVar3;
    (__position._M_current)->m_f64Z = P->m_f64Z;
    ppWVar2 = &(this->m_vPoints).
               super__Vector_base<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppWVar2 = *ppWVar2 + 1;
  }
  this->m_ui16NumPoints = this->m_ui16NumPoints + 1;
  return;
}

Assistant:

void Areal_Object_State_PDU::AddPoint( const WorldCoordinates & P )
{
    m_ui16PDULength += WorldCoordinates::WORLD_COORDINATES_SIZE;
    m_vPoints.push_back( P );
    ++m_ui16NumPoints;
}